

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::iterate(SRGBTestCase *this)

{
  int iVar1;
  ShaderSamplingType local_28;
  int local_24;
  int samplingTypeIdx;
  int endIdx;
  int startIdx;
  bool result;
  SRGBTestCase *this_local;
  
  samplingTypeIdx = -1;
  local_24 = -1;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
  if (this->m_samplingGroup == SHADERSAMPLINGGROUP_TEXTURE) {
    samplingTypeIdx = 0;
    local_24 = 5;
  }
  else if (this->m_samplingGroup == SHADERSAMPLINGGROUP_TEXEL_FETCH) {
    samplingTypeIdx = 5;
    local_24 = 7;
  }
  initVertexData(this);
  initFrameBuffer(this);
  local_28 = samplingTypeIdx;
  while( true ) {
    if (local_24 <= (int)local_28) {
      return STOP;
    }
    genShaderPrograms(this,local_28);
    uploadTextures(this);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])();
    deleteShaderPrograms(this);
    if (((byte)iVar1 & 1) != 1) break;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    local_28 = local_28 + TEXTURESAMPLING_TEXTURE_LOD;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Result verification failed");
  return STOP;
}

Assistant:

SRGBTestCase::IterateResult SRGBTestCase::iterate (void)
{
	bool	result;
	int		startIdx	= -1;
	int		endIdx		= -1;

	this->setupTest();

	if (m_samplingGroup == SHADERSAMPLINGGROUP_TEXTURE)
	{
		startIdx	= static_cast<int>(TEXTURESAMPLING_TEXTURE_START);
		endIdx		= static_cast<int>(TEXTURESAMPLING_TEXTURE_END);
	}
	else if (m_samplingGroup == SHADERSAMPLINGGROUP_TEXEL_FETCH)
	{
		startIdx	= static_cast<int>(TEXTURESAMPLING_TEXELFETCH_START);
		endIdx		= static_cast<int>(TEXTURESAMPLING_TEXELFETCH_END);
	}
	else
	{
		DE_FATAL("Error: Sampling group not defined");
	}

	this->initVertexData();
	this->initFrameBuffer();

	// loop through all sampling types in the required sampling group, performing individual tests for each
	for (int samplingTypeIdx = startIdx; samplingTypeIdx < endIdx; samplingTypeIdx++)
	{
		this->genShaderPrograms(static_cast<ShaderSamplingType>(samplingTypeIdx));
		this->uploadTextures();
		this->render();

		result = this->verifyResult();

		this->deleteShaderPrograms();

		if (result == true)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result verification failed");
			return STOP;
		}
	}

	return STOP;
}